

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O1

mraa_result_t mraa_pwm_unexport(mraa_pwm_context dev)

{
  mraa_result_t mVar1;
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: unexport: context is NULL");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    mraa_pwm_enable(dev,0);
    if (dev->owner != 0) {
      mVar1 = mraa_pwm_unexport_force(dev);
      return mVar1;
    }
    mVar1 = MRAA_ERROR_INVALID_PARAMETER;
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_pwm_unexport(mraa_pwm_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: unexport: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    mraa_pwm_enable(dev, 0);
    if (dev->owner) {
        return mraa_pwm_unexport_force(dev);
    }
    return MRAA_ERROR_INVALID_PARAMETER;
}